

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonProceduralExprVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::NonProceduralExprVisitor::visit<slang::ast::AssertionInstanceExpression>
          (Result *this,AssertionInstanceExpression *expr)

{
  Result *in_stack_00000008;
  AssertionInstanceExpression *in_stack_00000010;
  Expression *in_stack_00000098;
  Symbol *in_stack_000000a0;
  AnalyzedProcedure *in_stack_000000a8;
  TimingControl *in_stack_000000b0;
  AnalysisContext *in_stack_000000b8;
  AnalyzedAssertion *in_stack_000000c0;
  Result *in_stack_ffffffffffffffe8;
  
  getDefaultClocking(in_stack_ffffffffffffffe8);
  AnalyzedAssertion::AnalyzedAssertion
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a0,in_stack_00000098);
  ast::AssertionInstanceExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_same_v<T, CallExpression>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                // If we don't have a default clocking active in this scope then
                // we should check the call to be sure it has an explicit clock provided.
                if (getDefaultClocking() == nullptr)
                    ClockInference::checkSampledValueFuncs(context, containingSymbol, expr);
            }
        }
        else if constexpr (std::is_same_v<T, AssertionInstanceExpression>) {
            // We might want to find a place to store these analyzed assertions created in
            // non-procedural contexts, but for now it's enough to make sure they're valid.
            AnalyzedAssertion(context, getDefaultClocking(), nullptr, containingSymbol, expr);
        }

        if constexpr (HasVisitExprs<T, NonProceduralExprVisitor>) {
            expr.visitExprs(*this);
        }
    }